

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O1

uint __thiscall
ON_FunctionList::RemoveFunction
          (ON_FunctionList *this,_func_void_ON__UINT_PTR *function,ON__UINT_PTR function_parameter)

{
  void **p;
  bool bVar1;
  void **ppvVar2;
  uint uVar3;
  
  if (function == (_func_void_ON__UINT_PTR *)0x0) {
    uVar3 = 2;
  }
  else {
    bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
    uVar3 = 0;
    if (bVar1) {
      p = (void **)this->m_head;
      uVar3 = 2;
      if ((p != (void **)0x0) && (p[3] == (void *)function_parameter)) {
        ppvVar2 = &this->m_head;
        if (*p != (void *)0x0) {
          ppvVar2 = p;
        }
        *ppvVar2 = p[1];
        ppvVar2 = &this->m_tail;
        if (p[1] != (void *)0x0) {
          ppvVar2 = p + 1;
        }
        *ppvVar2 = *p;
        ON_FixedSizePool::ReturnElement(&this->m_fsp,p);
        uVar3 = 1;
      }
      ON_Lock::ReturnDefaultLock(&this->m_lock);
    }
  }
  return uVar3;
}

Assistant:

unsigned int ON_FunctionList::RemoveFunction(
    void (*function)(ON__UINT_PTR),
    ON__UINT_PTR function_parameter
    )
{
  if ( 0 == function)
    return 2;

  if ( false == m_lock.GetDefaultLock() )
    return 0;

  int rc = 2;
  struct tagFunctionItem* item = FindItem((struct tagFunctionItem*)m_head,function);
  if ( item && item->m_function_parameter == function_parameter )
  {
    rc = 1;
    if ( item->m_prev )
      item->m_prev = item->m_next;
    else
      m_head = item->m_next;
    if ( item->m_next )
      item->m_next = item->m_prev;
    else
      m_tail = item->m_prev;
    m_fsp.ReturnElement(item);
  }

  m_lock.ReturnDefaultLock();

  return rc;
}